

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

string * __thiscall
BCLog::Logger::LogTimestampStr_abi_cxx11_(Logger *this,time_point now,seconds mocktime)

{
  long lVar1;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_> t;
  duration<long,_std::ratio<1L,_1000000000L>_> d;
  bool bVar2;
  strong_ordering sVar3;
  char *fmt;
  type args;
  seconds __lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long in_RSI;
  string *in_RDI;
  long in_FS_OFFSET;
  string *strStamped;
  type now_seconds;
  seconds in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  char __c;
  undefined7 in_stack_fffffffffffffe98;
  undefined1 in_stack_fffffffffffffe9f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  strong_ordering sVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffee8;
  int64_t in_stack_ffffffffffffff68;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string(in_stack_fffffffffffffea0);
  if ((*(byte *)(in_RSI + 0xd2) & 1) != 0) {
    std::chrono::
    time_point_cast<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
              ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                *)in_stack_fffffffffffffe90);
    t.__d.__r._7_1_ = in_stack_fffffffffffffe9f;
    t.__d.__r._0_7_ = in_stack_fffffffffffffe98;
    fmt = (char *)TicksSinceEpoch<std::chrono::duration<long,std::ratio<1l,1l>>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1l>>>>
                            (t);
    FormatISO8601DateTime_abi_cxx11_(in_stack_ffffffffffffff68);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (in_stack_fffffffffffffee8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffe88.__r);
    if (((*(byte *)(in_RSI + 0xd3) & 1) != 0) &&
       (bVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      in_stack_fffffffffffffe88.__r), !bVar2)) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88.__r);
      args = std::chrono::operator-
                       ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                         *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88.__r);
      d.__r._7_1_ = in_stack_fffffffffffffe9f;
      d.__r._0_7_ = in_stack_fffffffffffffe98;
      Ticks<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                (d);
      tinyformat::format<long>(fmt,(long *)args.__r);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88.__r);
    }
    __c = (char)((ulong)in_stack_fffffffffffffe90 >> 0x38);
    __lhs = s<(char)48>();
    sVar3 = std::chrono::operator<=><long,_std::ratio<1L,_1L>,_long,_std::ratio<1L,_1L>_>
                      ((duration<long,_std::ratio<1L,_1L>_> *)__lhs.__r,
                       (duration<long,_std::ratio<1L,_1L>_> *)
                       CONCAT17(in_stack_fffffffffffffe9f,in_stack_fffffffffffffe98));
    sVar4 = sVar3;
    std::__cmp_cat::__unspec::__unspec
              ((__unspec *)in_stack_fffffffffffffe88.__r,(__unspec *)0xfe8df3);
    bVar2 = std::operator>(sVar4._M_value);
    if (bVar2) {
      __str = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              count_seconds(in_stack_fffffffffffffe88);
      FormatISO8601DateTime_abi_cxx11_(in_stack_ffffffffffffff68);
      std::operator+((char *)__lhs.__r,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(sVar3._M_value,in_stack_fffffffffffffe98));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs.__r,
                     (char *)CONCAT17(sVar3._M_value,in_stack_fffffffffffffe98));
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(sVar3._M_value,in_stack_fffffffffffffe98),__str);
      __c = (char)((ulong)__str >> 0x38);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88.__r);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88.__r);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe88.__r);
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator+=
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(sVar3._M_value,in_stack_fffffffffffffe98),__c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::string BCLog::Logger::LogTimestampStr(SystemClock::time_point now, std::chrono::seconds mocktime) const
{
    std::string strStamped;

    if (!m_log_timestamps)
        return strStamped;

    const auto now_seconds{std::chrono::time_point_cast<std::chrono::seconds>(now)};
    strStamped = FormatISO8601DateTime(TicksSinceEpoch<std::chrono::seconds>(now_seconds));
    if (m_log_time_micros && !strStamped.empty()) {
        strStamped.pop_back();
        strStamped += strprintf(".%06dZ", Ticks<std::chrono::microseconds>(now - now_seconds));
    }
    if (mocktime > 0s) {
        strStamped += " (mocktime: " + FormatISO8601DateTime(count_seconds(mocktime)) + ")";
    }
    strStamped += ' ';

    return strStamped;
}